

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI.cpp
# Opt level: O3

string * __thiscall
CLI::getSubCommand(string *__return_storage_ptr__,CLI *this,
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *subCommands,string *defaultCommand)

{
  pointer pcVar1;
  string *psVar2;
  string local_38;
  
  findSubCommand(&local_38,this,subCommands);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = &local_38;
  if (local_38._M_string_length == 0) {
    psVar2 = defaultCommand;
  }
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  if (local_38._M_string_length == 0) {
    local_38._M_string_length = defaultCommand->_M_string_length;
  }
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + local_38._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CLI::getSubCommand(const std::set<std::string>& subCommands, const std::string& defaultCommand) {
  const auto& subCommand = findSubCommand (subCommands);

  return subCommand.empty () ? defaultCommand : subCommand;
}